

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerApp::ValidatePSKd(Error *__return_storage_ptr__,string *aPSKd)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference pcVar4;
  v10 *this;
  unsigned_long *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  anon_class_1_0_00000001 local_3b2;
  v10 local_3b1;
  v10 *local_3b0;
  char *local_3a8;
  string local_3a0;
  Error local_380;
  anon_class_1_0_00000001 local_352;
  v10 local_351;
  v10 *local_350;
  char *local_348;
  string local_340;
  Error local_320;
  undefined1 local_2f1 [8];
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  anon_class_1_0_00000001 local_2ba;
  v10 local_2b9;
  v10 *local_2b8;
  char *local_2b0;
  string local_2a8;
  Error local_288;
  undefined1 local_259;
  string *local_258;
  string *aPSKd_local;
  Error *error;
  undefined1 local_218 [16];
  v10 *local_208;
  char *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  v10 *local_1e8;
  v10 *local_1e0;
  char *pcStack_1d8;
  string *local_1d0;
  v10 *local_1c8;
  v10 **local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> *local_1b8 [2];
  undefined1 local_1a8 [16];
  v10 *local_198;
  char *local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> *local_188;
  v10 *local_180;
  char *pcStack_178;
  string *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> *local_168 [3];
  undefined1 local_150 [16];
  v10 *local_140;
  char *local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> *local_130;
  v10 *local_128;
  char *pcStack_120;
  string *local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  Error **local_d0;
  undefined1 *local_c8;
  Error **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  Error **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char> **local_10;
  
  local_259 = 0;
  local_258 = aPSKd;
  aPSKd_local = (string *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar3 = std::__cxx11::string::size();
  if ((uVar3 < 6) || (uVar3 = std::__cxx11::string::size(), 0x20 < uVar3)) {
    ValidatePSKd::anon_class_1_0_00000001::operator()(&local_2ba);
    local_1c0 = &local_2b8;
    local_1c8 = &local_2b9;
    bVar5 = ::fmt::v10::operator()(local_1c8);
    local_2b0 = (char *)bVar5.size_;
    local_2b8 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::
    check_format_string<unsigned_long,_const_unsigned_long_&,_const_unsigned_long_&,_FMT_COMPILE_STRING,_0>
              ();
    __range2 = (string *)std::__cxx11::string::size();
    local_1d0 = &local_2a8;
    local_1e0 = local_2b8;
    pcStack_1d8 = local_2b0;
    local_1e8 = (v10 *)&__range2;
    local_1f0 = &kMinJoinerDeviceCredentialLength;
    local_1f8 = &kMaxJoinerDeviceCredentialLength;
    local_f0 = &local_1e0;
    local_208 = local_2b8;
    local_200 = local_2b0;
    local_e8 = local_208;
    pcStack_e0 = local_200;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_long_const,unsigned_long_const>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long,_unsigned_long>
                *)&error,local_1e8,&kMinJoinerDeviceCredentialLength,
               &kMaxJoinerDeviceCredentialLength,in_R8);
    local_c8 = local_218;
    local_d0 = &error;
    local_b8 = 0x444;
    fmt.size_ = 0x444;
    fmt.data_ = local_200;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_d0;
    local_c0 = local_d0;
    local_b0 = local_c8;
    local_a8 = local_d0;
    ::fmt::v10::vformat_abi_cxx11_(&local_2a8,local_208,fmt,args);
    Error::Error(&local_288,kInvalidArgs,&local_2a8);
    Error::operator=(__return_storage_ptr__,&local_288);
    Error::~Error(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  else {
    __end2._M_current = (char *)std::__cxx11::string::begin();
    register0x00000000 = std::__cxx11::string::end();
    while( true ) {
      this = (v10 *)(local_2f1 + 1);
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)this);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_2f1[0] = *pcVar4;
      iVar2 = isdigit((int)(char)local_2f1[0]);
      if ((iVar2 == 0) && (iVar2 = isupper((int)(char)local_2f1[0]), iVar2 == 0)) {
        ValidatePSKd::anon_class_1_0_00000001::operator()(&local_352);
        local_108 = &local_350;
        local_110 = &local_351;
        bVar5 = ::fmt::v10::operator()(local_110);
        local_348 = (char *)bVar5.size_;
        local_350 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::check_format_string<char_&,_FMT_COMPILE_STRING,_0>();
        local_118 = &local_340;
        local_128 = local_350;
        pcStack_120 = local_348;
        local_130 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char>
                     *)local_2f1;
        local_a0 = &local_128;
        local_140 = local_350;
        local_138 = local_348;
        local_98 = local_140;
        pcStack_90 = local_138;
        local_168[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char>
                                 (local_130,this,(char *)local_118);
        local_60 = local_150;
        local_68 = local_168;
        local_50 = 8;
        fmt_00.size_ = 8;
        fmt_00.data_ = local_138;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_68;
        local_58 = local_68;
        local_48 = local_60;
        local_40 = local_68;
        ::fmt::v10::vformat_abi_cxx11_(&local_340,local_140,fmt_00,args_00);
        Error::Error(&local_320,kInvalidArgs,&local_340);
        Error::operator=(__return_storage_ptr__,&local_320);
        Error::~Error(&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        return __return_storage_ptr__;
      }
      if ((((local_2f1[0] == 'I') || (local_2f1[0] == 'O')) || (local_2f1[0] == 'Q')) ||
         (local_2f1[0] == 'Z')) {
        ValidatePSKd::anon_class_1_0_00000001::operator()(&local_3b2);
        local_f8 = &local_3b0;
        local_100 = &local_3b1;
        bVar5 = ::fmt::v10::operator()(local_100);
        local_3a8 = (char *)bVar5.size_;
        local_3b0 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::check_format_string<char_&,_FMT_COMPILE_STRING,_0>();
        local_170 = &local_3a0;
        local_180 = local_3b0;
        pcStack_178 = local_3a8;
        local_188 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char>
                     *)local_2f1;
        local_80 = &local_180;
        local_198 = local_3b0;
        local_190 = local_3a8;
        local_78 = local_198;
        pcStack_70 = local_190;
        local_1b8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char>
                                 (local_188,this,(char *)local_170);
        local_30 = local_1a8;
        local_38 = local_1b8;
        local_20 = 8;
        fmt_01.size_ = 8;
        fmt_01.data_ = local_190;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_38;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_3a0,local_198,fmt_01,args_01);
        Error::Error(&local_380,kInvalidArgs,&local_3a0);
        Error::operator=(__return_storage_ptr__,&local_380);
        Error::~Error(&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::ValidatePSKd(const std::string &aPSKd)
{
    Error error;

    VerifyOrExit(aPSKd.size() >= kMinJoinerDeviceCredentialLength && aPSKd.size() <= kMaxJoinerDeviceCredentialLength,
                 error = ERROR_INVALID_ARGS("PSKd length(={}) exceeds range [{}, {}]", aPSKd.size(),
                                            kMinJoinerDeviceCredentialLength, kMaxJoinerDeviceCredentialLength));

    for (auto c : aPSKd)
    {
        VerifyOrExit(isdigit(c) || isupper(c),
                     error = ERROR_INVALID_ARGS("PSKd includes non-digit and non-uppercase characters: {}", c));
        VerifyOrExit(c != 'I' && c != 'O' && c != 'Q' && c != 'Z',
                     error = ERROR_INVALID_ARGS("PSKd includes invalid uppercase characters: {}", c));
    }

exit:
    return error;
}